

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmberImproperTorsionType.hpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *os,AmberImproperTorsionType *ott)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"This AmberImproperTorsionType has below form:",0x2d);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(ott->v2_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/2*(1-cos(2*(phi-phi0)))",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, AmberImproperTorsionType& ott) {
    os << "This AmberImproperTorsionType has below form:" << std::endl;
    os << ott.v2_ << "/2*(1-cos(2*(phi-phi0)))" << std::endl;
    return os;
  }